

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_writeshdrs(GlobalVars *gv,FILE *f,uint32_t reloffset,uint32_t stabndx)

{
  uint be_00;
  uint32_t uVar1;
  node *pnVar2;
  LinkedSection *pLVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint32_t type;
  ShdrNode *shn;
  LinkedSection *ls;
  bool be;
  char *fn;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint8_t fmask;
  uint8_t flags;
  uint uVar4;
  uint8_t type_00;
  char *name;
  
  name = "elf32_writeshdrs():";
  be_00 = (uint)(elf_endianess == '\x01');
  while (pnVar2 = remhead(&shdrlist), pnVar2 != (node *)0x0) {
    uVar1 = read32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    if ((uVar1 == 4) || (uVar1 == 9)) {
      uVar1 = read32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      if ((uVar1 & 2) == 0) {
        uVar4 = be_00;
        read32(be_00,in_stack_ffffffffffffffa8);
        write32(be_00,in_stack_ffffffffffffffa8,0);
        write32(be_00,in_stack_ffffffffffffffa8,0);
        in_stack_ffffffffffffffb4 = be_00;
        be_00 = uVar4;
      }
      else {
        pLVar3 = find_lnksec((GlobalVars *)CONCAT44(in_EDX,in_ECX),name,(uint8_t)(be_00 >> 0x18),
                             (uint8_t)(be_00 >> 0x10),(uint8_t)(be_00 >> 8),(uint8_t)be_00);
        if (pLVar3 == (LinkedSection *)0x0) {
          ierror("%s %s",name,".dynsym");
        }
        else {
          write32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
        }
        uVar1 = read32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
        if (uVar1 != 0) {
          pLVar3 = find_lnksec((GlobalVars *)CONCAT44(in_EDX,in_ECX),name,(uint8_t)(be_00 >> 0x18),
                               (uint8_t)(be_00 >> 0x10),(uint8_t)(be_00 >> 8),(uint8_t)be_00);
          if (pLVar3 == (LinkedSection *)0x0) {
            ierror("%s %s",name,".plt");
          }
          else {
            write32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
          }
        }
      }
    }
    else {
      fmask = (uint8_t)(be_00 >> 8);
      flags = (uint8_t)(be_00 >> 0x10);
      type_00 = (uint8_t)(be_00 >> 0x18);
      if (uVar1 == 5) {
        pLVar3 = find_lnksec((GlobalVars *)CONCAT44(in_EDX,in_ECX),name,type_00,flags,fmask,
                             (uint8_t)be_00);
        if (pLVar3 == (LinkedSection *)0x0) {
          ierror("%s %s",name,".dynsym");
        }
        else {
          write32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
        }
      }
      else if ((uVar1 == 6) || (uVar1 == 0xb)) {
        pLVar3 = find_lnksec((GlobalVars *)CONCAT44(in_EDX,in_ECX),name,type_00,flags,fmask,
                             (uint8_t)be_00);
        if (pLVar3 == (LinkedSection *)0x0) {
          ierror("%s %s",name,".dynstr");
        }
        else {
          write32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
        }
        if (uVar1 == 0xb) {
          write32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
        }
      }
    }
    fwritex((FILE *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffa8,0x12cadc);
  }
  return;
}

Assistant:

static void elf32_writeshdrs(struct GlobalVars *gv,FILE *f,
                             uint32_t reloffset,uint32_t stabndx)
/* write all section headers */
{
  const char *fn = "elf32_writeshdrs():";
  bool be = elf_endianess == _BIG_ENDIAN_;
  struct LinkedSection *ls;
  struct ShdrNode *shn;
  uint32_t type;

  while (shn = (struct ShdrNode *)remhead(&shdrlist)) {
    type = read32(be,shn->s.sh_type);

    /* handle REL and RELA sections */
    if (type == SHT_RELA || type == SHT_REL) {
      if (read32(be,shn->s.sh_flags) & SHF_ALLOC) {
        /* allocated, so probably dynamic relocs: link to .dynsym */
        if (ls = find_lnksec(gv,dynsym_name,0,0,0,0))
          write32(be,shn->s.sh_link,(uint32_t)ls->index);
        else
          ierror("%s %s",fn,dynsym_name);

        if (read32(be,shn->s.sh_info) != 0) {
          /* link to .plt requested in info field */
          if (ls = find_lnksec(gv,plt_name,0,0,0,0))
            write32(be,shn->s.sh_info,(uint32_t)ls->index);
          else
            ierror("%s %s",fn,plt_name);
        }
      }
      else {
        /* patch correct sh_offset and sh_link for reloc header */
        write32(be,shn->s.sh_offset,read32(be,shn->s.sh_offset)+reloffset);
        write32(be,shn->s.sh_link,stabndx);
      }
    }

    /* handle HASH sections, which need a .dynsym link */
    else if (type == SHT_HASH) {
      if (ls = find_lnksec(gv,dynsym_name,0,0,0,0))
        write32(be,shn->s.sh_link,(uint32_t)ls->index);
      else
        ierror("%s %s",fn,dynsym_name);
    }

    /* handle DYNAMIC and DYNSYM sections */
    else if (type==SHT_DYNAMIC || type==SHT_DYNSYM) {
      /* write .dynstr link */
      if (ls = find_lnksec(gv,dynstr_name,0,0,0,0))
        write32(be,shn->s.sh_link,(uint32_t)ls->index);
      else
        ierror("%s %s",fn,dynstr_name);

      if (type == SHT_DYNSYM) {
        write32(be,shn->s.sh_info,1);  /* @@ FIXME! number of local symbols */
      }
    }

    fwritex(f,&shn->s,sizeof(struct Elf32_Shdr));
  }
}